

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::MessageGenerator::GenerateMessageSerializationMethods
          (MessageGenerator *this,Printer *printer)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  ExtensionRange *range;
  undefined8 *puVar4;
  FieldGeneratorMap *this_00;
  ulong uVar5;
  FieldDescriptor **ppFVar6;
  undefined8 uVar7;
  FieldGenerator *pFVar8;
  Descriptor *pDVar9;
  Descriptor *descriptor;
  Descriptor *descriptor_00;
  int iVar10;
  long lVar11;
  undefined8 *puVar12;
  char *pcVar13;
  __normal_iterator<const_google::protobuf::Descriptor::ExtensionRange_**,_std::vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>_>
  __i;
  undefined8 *puVar14;
  long lVar15;
  bool bVar16;
  scoped_array<const_google::protobuf::FieldDescriptor_*> sorted_fields;
  vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
  sorted_extensions;
  undefined1 local_a0 [16];
  undefined8 *puStack_90;
  long local_88;
  FieldGeneratorMap *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  string local_50;
  
  local_a0._0_8_ = anon_unknown_5::SortFieldsByNumber(this->descriptor_);
  local_a0._8_8_ = (undefined8 *)0x0;
  puStack_90 = (undefined8 *)0x0;
  local_88 = 0;
  pDVar9 = this->descriptor_;
  if (0 < *(int *)(pDVar9 + 0x58)) {
    lVar15 = 0;
    lVar11 = 0;
    do {
      local_70._M_allocated_capacity = *(long *)(pDVar9 + 0x60) + lVar15;
      std::
      vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>
      ::emplace_back<google::protobuf::Descriptor::ExtensionRange_const*>
                ((vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>
                  *)(local_a0 + 8),(ExtensionRange **)&local_70._M_allocated_capacity);
      lVar11 = lVar11 + 1;
      pDVar9 = this->descriptor_;
      lVar15 = lVar15 + 8;
    } while (lVar11 < *(int *)(pDVar9 + 0x58));
  }
  puVar4 = puStack_90;
  uVar7 = local_a0._8_8_;
  if ((undefined8 *)local_a0._8_8_ != puStack_90) {
    lVar15 = (long)puStack_90 - local_a0._8_8_;
    uVar5 = lVar15 >> 3;
    lVar11 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar11 == 0; lVar11 = lVar11 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor::ExtensionRange_const**,std::vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::java::(anonymous_namespace)::ExtensionRangeOrdering>>
              (local_a0._8_8_,puStack_90,((uint)lVar11 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar15 < 0x81) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor::ExtensionRange_const**,std::vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::java::(anonymous_namespace)::ExtensionRangeOrdering>>
                (uVar7,puVar4);
    }
    else {
      puVar14 = (undefined8 *)(uVar7 + 0x80);
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor::ExtensionRange_const**,std::vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::java::(anonymous_namespace)::ExtensionRangeOrdering>>
                (uVar7,puVar14);
      for (; puVar14 != puVar4; puVar14 = puVar14 + 1) {
        piVar2 = (int *)puVar14[-1];
        piVar3 = (int *)*puVar14;
        iVar1 = *piVar3;
        iVar10 = *piVar2;
        puVar12 = puVar14;
        while (iVar1 < iVar10) {
          *puVar12 = piVar2;
          piVar2 = (int *)puVar12[-2];
          puVar12 = puVar12 + -1;
          iVar10 = *piVar2;
        }
        *puVar12 = piVar3;
      }
    }
  }
  io::Printer::Print(printer,
                     "public void writeTo(com.google.protobuf.CodedOutputStream output)\n                    throws java.io.IOException {\n"
                    );
  io::Printer::Indent(printer);
  uVar7 = printer;
  io::Printer::Print(printer,"getSerializedSize();\n");
  pDVar9 = this->descriptor_;
  if (0 < *(int *)(pDVar9 + 0x58)) {
    if (*(char *)(*(long *)(pDVar9 + 0x20) + 0x58) == '\x01') {
      bVar16 = *(int *)(*(long *)(*(long *)(pDVar9 + 0x10) + 0x88) + 0x50) == 3;
      pcVar13 = "";
      if (bVar16) {
        pcVar13 = "Lite";
      }
      local_70._M_allocated_capacity = (size_type)&local_60;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,pcVar13,pcVar13 + (ulong)bVar16 * 4);
      ClassName_abi_cxx11_(&local_50,(java *)this->descriptor_,descriptor);
      io::Printer::Print(printer,
                         "com.google.protobuf.GeneratedMessage$lite$\n  .ExtendableMessage<$classname$>.ExtensionWriter extensionWriter =\n    newMessageSetExtensionWriter();\n"
                         ,"lite",(string *)&local_70,"classname",&local_50);
    }
    else {
      bVar16 = *(int *)(*(long *)(*(long *)(pDVar9 + 0x10) + 0x88) + 0x50) == 3;
      pcVar13 = "";
      if (bVar16) {
        pcVar13 = "Lite";
      }
      local_70._M_allocated_capacity = (size_type)&local_60;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,pcVar13,pcVar13 + (ulong)bVar16 * 4);
      ClassName_abi_cxx11_(&local_50,(java *)this->descriptor_,descriptor_00);
      io::Printer::Print(printer,
                         "com.google.protobuf.GeneratedMessage$lite$\n  .ExtendableMessage<$classname$>.ExtensionWriter extensionWriter =\n    newExtensionWriter();\n"
                         ,"lite",(string *)&local_70,"classname",&local_50);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    uVar7 = local_70._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_allocated_capacity != &local_60) {
      operator_delete((void *)local_70._M_allocated_capacity,local_60._M_allocated_capacity + 1);
    }
  }
  local_78 = &this->field_generators_;
  iVar10 = 0;
  uVar5 = 0;
LAB_001a722b:
  uVar5 = (ulong)(int)uVar5;
  do {
    pDVar9 = this->descriptor_;
    if ((*(int *)(pDVar9 + 0x2c) <= iVar10) &&
       ((ulong)((long)puStack_90 - local_a0._8_8_ >> 3) <= uVar5)) {
      if (*(int *)(*(long *)(*(long *)(pDVar9 + 0x10) + 0x88) + 0x50) != 3) {
        pcVar13 = "getUnknownFields().writeTo(output);\n";
        if (*(char *)(*(long *)(pDVar9 + 0x20) + 0x58) != '\0') {
          pcVar13 = "getUnknownFields().writeAsMessageSetTo(output);\n";
        }
        io::Printer::Print(printer,pcVar13);
      }
      io::Printer::Outdent(printer);
      io::Printer::Print(printer,
                         "}\n\nprivate int memoizedSerializedSize = -1;\npublic int getSerializedSize() {\n  int size = memoizedSerializedSize;\n  if (size != -1) return size;\n\n  size = 0;\n"
                        );
      io::Printer::Indent(printer);
      this_00 = local_78;
      pDVar9 = this->descriptor_;
      if (0 < *(int *)(pDVar9 + 0x2c)) {
        lVar11 = 0;
        do {
          ppFVar6 = internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::operator[]
                              ((scoped_array<const_google::protobuf::FieldDescriptor_*> *)local_a0,
                               lVar11);
          pFVar8 = FieldGeneratorMap::get(this_00,*ppFVar6);
          (*pFVar8->_vptr_FieldGenerator[0xf])(pFVar8,printer);
          lVar11 = lVar11 + 1;
          pDVar9 = this->descriptor_;
        } while (lVar11 < *(int *)(pDVar9 + 0x2c));
      }
      if (0 < *(int *)(pDVar9 + 0x58)) {
        pcVar13 = "size += extensionsSerializedSize();\n";
        if (*(char *)(*(long *)(pDVar9 + 0x20) + 0x58) != '\0') {
          pcVar13 = "size += extensionsSerializedSizeAsMessageSet();\n";
        }
        io::Printer::Print(printer,pcVar13);
      }
      if (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0x88) + 0x50) != 3) {
        pcVar13 = "size += getUnknownFields().getSerializedSize();\n";
        if (*(char *)(*(long *)(this->descriptor_ + 0x20) + 0x58) != '\0') {
          pcVar13 = "size += getUnknownFields().getSerializedSizeAsMessageSet();\n";
        }
        io::Printer::Print(printer,pcVar13);
      }
      io::Printer::Outdent(printer);
      io::Printer::Print(printer,"  memoizedSerializedSize = size;\n  return size;\n}\n\n");
      io::Printer::Print(printer,
                         "private static final long serialVersionUID = 0L;\n@java.lang.Override\nprotected java.lang.Object writeReplace()\n    throws java.io.ObjectStreamException {\n  return super.writeReplace();\n}\n\n"
                        );
      if ((undefined8 *)local_a0._8_8_ != (undefined8 *)0x0) {
        operator_delete((void *)local_a0._8_8_,local_88 - local_a0._8_8_);
      }
      if ((FieldDescriptor **)local_a0._0_8_ != (FieldDescriptor **)0x0) {
        operator_delete__((void *)local_a0._0_8_);
      }
      return;
    }
    if (iVar10 == *(int *)(pDVar9 + 0x2c)) {
      GenerateSerializeOneExtensionRange
                ((MessageGenerator *)uVar7,printer,*(ExtensionRange **)(local_a0._8_8_ + uVar5 * 8))
      ;
    }
    else {
      lVar11 = (long)puStack_90 - local_a0._8_8_;
      uVar7 = local_a0;
      ppFVar6 = internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::operator[]
                          ((scoped_array<const_google::protobuf::FieldDescriptor_*> *)uVar7,
                           (long)iVar10);
      if (uVar5 == lVar11 >> 3) {
        uVar7 = FieldGeneratorMap::get(local_78,*ppFVar6);
        (*(*(_func_int ***)uVar7)[0xe])(uVar7,printer);
        goto LAB_001a72e5;
      }
      range = *(ExtensionRange **)(local_a0._8_8_ + uVar5 * 8);
      if (*(int *)(*ppFVar6 + 0x28) < range->start) break;
      GenerateSerializeOneExtensionRange((MessageGenerator *)uVar7,printer,range);
    }
    uVar5 = uVar5 + 1;
  } while( true );
  ppFVar6 = internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::operator[]
                      ((scoped_array<const_google::protobuf::FieldDescriptor_*> *)local_a0,
                       (long)iVar10);
  uVar7 = FieldGeneratorMap::get(local_78,*ppFVar6);
  (*(*(_func_int ***)uVar7)[0xe])(uVar7,printer);
LAB_001a72e5:
  iVar10 = iVar10 + 1;
  goto LAB_001a722b;
}

Assistant:

void MessageGenerator::
GenerateMessageSerializationMethods(io::Printer* printer) {
  scoped_array<const FieldDescriptor*> sorted_fields(
    SortFieldsByNumber(descriptor_));

  vector<const Descriptor::ExtensionRange*> sorted_extensions;
  for (int i = 0; i < descriptor_->extension_range_count(); ++i) {
    sorted_extensions.push_back(descriptor_->extension_range(i));
  }
  sort(sorted_extensions.begin(), sorted_extensions.end(),
       ExtensionRangeOrdering());

  printer->Print(
    "public void writeTo(com.google.protobuf.CodedOutputStream output)\n"
    "                    throws java.io.IOException {\n");
  printer->Indent();
  // writeTo(CodedOutputStream output) might be invoked without
  // getSerializedSize() ever being called, but we need the memoized
  // sizes in case this message has packed fields. Rather than emit checks for
  // each packed field, just call getSerializedSize() up front for all messages.
  // In most cases, getSerializedSize() will have already been called anyway by
  // one of the wrapper writeTo() methods, making this call cheap.
  printer->Print(
    "getSerializedSize();\n");

  if (descriptor_->extension_range_count() > 0) {
    if (descriptor_->options().message_set_wire_format()) {
      printer->Print(
        "com.google.protobuf.GeneratedMessage$lite$\n"
        "  .ExtendableMessage<$classname$>.ExtensionWriter extensionWriter =\n"
        "    newMessageSetExtensionWriter();\n",
        "lite", HasDescriptorMethods(descriptor_) ? "" : "Lite",
        "classname", ClassName(descriptor_));
    } else {
      printer->Print(
        "com.google.protobuf.GeneratedMessage$lite$\n"
        "  .ExtendableMessage<$classname$>.ExtensionWriter extensionWriter =\n"
        "    newExtensionWriter();\n",
        "lite", HasDescriptorMethods(descriptor_) ? "" : "Lite",
        "classname", ClassName(descriptor_));
    }
  }

  // Merge the fields and the extension ranges, both sorted by field number.
  for (int i = 0, j = 0;
       i < descriptor_->field_count() || j < sorted_extensions.size();
       ) {
    if (i == descriptor_->field_count()) {
      GenerateSerializeOneExtensionRange(printer, sorted_extensions[j++]);
    } else if (j == sorted_extensions.size()) {
      GenerateSerializeOneField(printer, sorted_fields[i++]);
    } else if (sorted_fields[i]->number() < sorted_extensions[j]->start) {
      GenerateSerializeOneField(printer, sorted_fields[i++]);
    } else {
      GenerateSerializeOneExtensionRange(printer, sorted_extensions[j++]);
    }
  }

  if (HasUnknownFields(descriptor_)) {
    if (descriptor_->options().message_set_wire_format()) {
      printer->Print(
        "getUnknownFields().writeAsMessageSetTo(output);\n");
    } else {
      printer->Print(
        "getUnknownFields().writeTo(output);\n");
    }
  }

  printer->Outdent();
  printer->Print(
    "}\n"
    "\n"
    "private int memoizedSerializedSize = -1;\n"
    "public int getSerializedSize() {\n"
    "  int size = memoizedSerializedSize;\n"
    "  if (size != -1) return size;\n"
    "\n"
    "  size = 0;\n");
  printer->Indent();

  for (int i = 0; i < descriptor_->field_count(); i++) {
    field_generators_.get(sorted_fields[i]).GenerateSerializedSizeCode(printer);
  }

  if (descriptor_->extension_range_count() > 0) {
    if (descriptor_->options().message_set_wire_format()) {
      printer->Print(
        "size += extensionsSerializedSizeAsMessageSet();\n");
    } else {
      printer->Print(
        "size += extensionsSerializedSize();\n");
    }
  }

  if (HasUnknownFields(descriptor_)) {
    if (descriptor_->options().message_set_wire_format()) {
      printer->Print(
        "size += getUnknownFields().getSerializedSizeAsMessageSet();\n");
    } else {
      printer->Print(
        "size += getUnknownFields().getSerializedSize();\n");
    }
  }

  printer->Outdent();
  printer->Print(
    "  memoizedSerializedSize = size;\n"
    "  return size;\n"
    "}\n"
    "\n");

  printer->Print(
    "private static final long serialVersionUID = 0L;\n"
    "@java.lang.Override\n"
    "protected java.lang.Object writeReplace()\n"
    "    throws java.io.ObjectStreamException {\n"
    "  return super.writeReplace();\n"
    "}\n"
    "\n");
}